

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O1

int lddmc_iscopy(MDD mdd)

{
  uint uVar1;
  
  uVar1 = 0;
  if (1 < mdd) {
    uVar1 = *(uint *)(nodes->data + mdd * 0x10 + 8) >> 0x10 & 1;
  }
  return uVar1;
}

Assistant:

int
lddmc_iscopy(MDD mdd)
{
    if (mdd <= lddmc_true) return 0;

    mddnode_t n = LDD_GETNODE(mdd);
    return mddnode_getcopy(n) ? 1 : 0;
}